

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O1

void __thiscall p2t::SweepContext::~SweepContext(SweepContext *this)

{
  list<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *plVar1;
  Point *pPVar2;
  AdvancingFront *this_00;
  pointer ppPVar3;
  _List_node_base *p_Var4;
  pointer ppTVar5;
  bool bVar6;
  pointer ppEVar7;
  ulong uVar8;
  ulong uVar9;
  _List_node_base *p_Var10;
  
  pPVar2 = this->head_;
  if (pPVar2 != (Point *)0x0) {
    ppEVar7 = (pPVar2->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar7 != (pointer)0x0) {
      operator_delete(ppEVar7);
    }
    operator_delete(pPVar2);
  }
  pPVar2 = this->tail_;
  if (pPVar2 != (Point *)0x0) {
    ppEVar7 = (pPVar2->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar7 != (pointer)0x0) {
      operator_delete(ppEVar7);
    }
    operator_delete(pPVar2);
  }
  this_00 = this->front_;
  if (this_00 != (AdvancingFront *)0x0) {
    AdvancingFront::~AdvancingFront(this_00);
    operator_delete(this_00);
  }
  if (this->af_head_ != (Node *)0x0) {
    operator_delete(this->af_head_);
  }
  if (this->af_middle_ != (Node *)0x0) {
    operator_delete(this->af_middle_);
  }
  if (this->af_tail_ != (Node *)0x0) {
    operator_delete(this->af_tail_);
  }
  plVar1 = &this->map_;
  for (p_Var10 = (this->map_).super__List_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>.
                 _M_impl._M_node.super__List_node_base._M_next; p_Var10 != (_List_node_base *)plVar1
      ; p_Var10 = p_Var10->_M_next) {
    if (p_Var10[1]._M_next != (_List_node_base *)0x0) {
      operator_delete(p_Var10[1]._M_next);
    }
  }
  ppEVar7 = (this->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar7) {
    uVar8 = 0;
    uVar9 = 1;
    do {
      if (ppEVar7[uVar8] != (Edge *)0x0) {
        operator_delete(ppEVar7[uVar8]);
      }
      ppEVar7 = (this->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar6 = uVar9 < (ulong)((long)(this->edge_list).
                                    super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar7 >> 3);
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar6);
  }
  ppPVar3 = (this->points_).super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppPVar3 != (pointer)0x0) {
    operator_delete(ppPVar3);
  }
  p_Var10 = (plVar1->super__List_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>)._M_impl.
            _M_node.super__List_node_base._M_next;
  while (p_Var10 != (_List_node_base *)plVar1) {
    p_Var4 = p_Var10->_M_next;
    operator_delete(p_Var10);
    p_Var10 = p_Var4;
  }
  ppTVar5 = (this->triangles_).super__Vector_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar5 != (pointer)0x0) {
    operator_delete(ppTVar5);
  }
  ppEVar7 = (this->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar7 == (pointer)0x0) {
    return;
  }
  operator_delete(ppEVar7);
  return;
}

Assistant:

SweepContext::~SweepContext()
{

    // Clean up memory

    delete head_;
    delete tail_;
    delete front_;
    delete af_head_;
    delete af_middle_;
    delete af_tail_;

    typedef std::list<Triangle*> type_list;

    for(type_list::iterator iter = map_.begin(); iter != map_.end(); ++iter) {
        Triangle* ptr = *iter;
        delete ptr;
    }

     for(unsigned int i = 0; i < edge_list.size(); i++) {
        delete edge_list[i];
    }

}